

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O1

Set * raviX_set_create(_func_uint32_t_void_ptr *hash_function,
                      _func_int_void_ptr_void_ptr *key_equals_function)

{
  Set *ptr;
  SetEntry *pSVar1;
  
  ptr = (Set *)raviX_malloc(0x30);
  ptr->size = 5;
  ptr->rehash = 3;
  ptr->max_entries = 2;
  ptr->size_index = 0;
  ptr->hash_function = hash_function;
  ptr->key_equals_function = key_equals_function;
  pSVar1 = (SetEntry *)raviX_calloc(5,0x10);
  ptr->table = pSVar1;
  ptr->entries = 0;
  ptr->deleted_entries = 0;
  if (pSVar1 == (SetEntry *)0x0) {
    raviX_free(ptr);
    ptr = (Set *)0x0;
  }
  return ptr;
}

Assistant:

Set *raviX_set_create(uint32_t (*hash_function)(const void *key),
	   int (*key_equals_function)(const void *a,
				   const void *b))
{
	Set *set;

	set = (Set *) raviX_malloc(sizeof(*set));

	set->size_index = 0;
	set->size = hash_sizes[set->size_index].size;
	set->rehash = hash_sizes[set->size_index].rehash;
	set->max_entries = hash_sizes[set->size_index].max_entries;
	set->hash_function = hash_function;
	set->key_equals_function = key_equals_function;
	set->table = (SetEntry *) raviX_calloc(set->size, sizeof(*set->table));
	set->entries = 0;
	set->deleted_entries = 0;

	if (set->table == NULL) {
		raviX_free(set);
		return NULL;
	}

	return set;
}